

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::
HeapDisposer<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>_>
::disposeImpl(HeapDisposer<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>_>
              *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>_>
  *this_local;
  
  if (pointer != (void *)0x0) {
    Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::
    Impl<kj::MainBuilder::MainImpl>::~Impl((Impl<kj::MainBuilder::MainImpl> *)pointer);
    operator_delete(pointer,0x18);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }